

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  long lVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  uint uVar6;
  ulong dindex;
  allocator<char> local_c2;
  allocator<char> local_c1;
  Directory d;
  string startPath;
  string finishPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string fname;
  
  lVar2 = std::__cxx11::string::find((char *)path,0x2209d4);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
    return;
  }
  std::__cxx11::string::substr((ulong)&startPath,(ulong)path);
  std::__cxx11::string::substr((ulong)&finishPath,(ulong)path);
  cmsys::Directory::Directory(&d);
  SVar3 = cmsys::Directory::Load(&d,&startPath,(string *)0x0);
  if (SVar3.Kind_ == Success) {
    uVar6 = 0;
    while( true ) {
      uVar4 = cmsys::Directory::GetNumberOfFiles(&d);
      dindex = (ulong)uVar6;
      if (uVar4 <= dindex) break;
      pcVar5 = cmsys::Directory::GetFile(&d,dindex);
      std::__cxx11::string::string<std::allocator<char>>((string *)&fname,pcVar5,&local_c2);
      bVar1 = std::operator!=(&fname,".");
      if (bVar1) {
        pcVar5 = cmsys::Directory::GetFile(&d,dindex);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar5,&local_c1);
        bVar1 = std::operator!=(&local_70,"..");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&fname);
        if (bVar1) {
          local_c2 = (allocator<char>)0x2f;
          local_70._M_dataplus._M_p = cmsys::Directory::GetFile(&d,dindex);
          cmStrCat<std::__cxx11::string&,char,char_const*>
                    (&fname,&startPath,(char *)&local_c2,(char **)&local_70);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&fname);
          if (bVar1) {
            std::__cxx11::string::append((string *)&fname);
            GlobDirs(&fname,files);
          }
          goto LAB_00113563;
        }
      }
      else {
LAB_00113563:
        std::__cxx11::string::~string((string *)&fname);
      }
      uVar6 = uVar6 + 1;
    }
  }
  cmsys::Directory::~Directory(&d);
  std::__cxx11::string::~string((string *)&finishPath);
  std::__cxx11::string::~string((string *)&startPath);
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = cmStrCat(startPath, '/', d.GetFile(i));
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}